

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteFixed32Array
               (uint32 *a,int n,CodedOutputStream *output)

{
  undefined8 in_RDX;
  undefined4 in_ESI;
  undefined4 in_stack_fffffffffffffff0;
  
  WriteArray<unsigned_int>
            ((uint *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(int)((ulong)in_RDX >> 0x20),
             (CodedOutputStream *)0x40fb23);
  return;
}

Assistant:

void WireFormatLite::WriteFixed32Array(const uint32* a, int n,
                                       io::CodedOutputStream* output) {
  WriteArray<uint32>(a, n, output);
}